

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.cpp
# Opt level: O1

void poly1305_donna::poly1305_update(poly1305_context *st,uchar *m,size_t bytes)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (st->leftover != 0) {
    uVar2 = 0x10 - st->leftover;
    if (bytes <= uVar2) {
      uVar2 = bytes;
    }
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        st->buffer[uVar3 + st->leftover] = m[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    uVar3 = st->leftover + uVar2;
    st->leftover = uVar3;
    if (uVar3 < 0x10) goto LAB_0077d85e;
    m = m + uVar2;
    bytes = bytes - uVar2;
    poly1305_blocks(st,st->buffer,0x10);
    st->leftover = 0;
  }
  if (0xf < bytes) {
    poly1305_blocks(st,m,bytes & 0xfffffffffffffff0);
    m = m + (bytes & 0xfffffffffffffff0);
    bytes = (size_t)((uint)bytes & 0xf);
  }
  if (bytes != 0) {
    uVar2 = 0;
    do {
      st->buffer[uVar2 + st->leftover] = m[uVar2];
      uVar2 = uVar2 + 1;
    } while (bytes != uVar2);
    st->leftover = st->leftover + bytes;
  }
LAB_0077d85e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void poly1305_update(poly1305_context *st, const unsigned char *m, size_t bytes) noexcept {
    size_t i;

    /* handle leftover */
    if (st->leftover) {
        size_t want = (POLY1305_BLOCK_SIZE - st->leftover);
        if (want > bytes) {
            want = bytes;
        }
        for (i = 0; i < want; i++) {
            st->buffer[st->leftover + i] = m[i];
        }
        bytes -= want;
        m += want;
        st->leftover += want;
        if (st->leftover < POLY1305_BLOCK_SIZE) return;
        poly1305_blocks(st, st->buffer, POLY1305_BLOCK_SIZE);
        st->leftover = 0;
    }

    /* process full blocks */
    if (bytes >= POLY1305_BLOCK_SIZE) {
        size_t want = (bytes & ~(POLY1305_BLOCK_SIZE - 1));
        poly1305_blocks(st, m, want);
        m += want;
        bytes -= want;
    }

    /* store leftover */
    if (bytes) {
        for (i = 0; i < bytes; i++) {
            st->buffer[st->leftover + i] = m[i];
        }
        st->leftover += bytes;
    }
}